

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void ReadVars(PNGHandle *png,SDWORD *vars,size_t count,DWORD id)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  DWORD var;
  FPNGChunkArchive arc;
  DWORD local_33c;
  size_t local_338;
  FPNGChunkArchive local_330;
  
  local_338 = count;
  uVar1 = M_FindPNGChunk(png,id);
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    FPNGChunkArchive::FPNGChunkArchive(&local_330,png->File->File,id,(ulong)uVar1);
    uVar3 = (ulong)(uVar1 >> 2);
    if (3 < uVar1) {
      uVar2 = 0;
      do {
        FArchive::operator<<(&local_330.super_FArchive,&local_33c);
        vars[uVar2] = local_33c;
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    FileReader::ResetFilePtr(png->File);
    FPNGChunkArchive::~FPNGChunkArchive(&local_330);
  }
  if (uVar3 <= local_338 && local_338 - uVar3 != 0) {
    memset(vars + uVar3,0,(local_338 - uVar3) * 4);
  }
  return;
}

Assistant:

static void ReadVars (PNGHandle *png, SDWORD *vars, size_t count, DWORD id)
{
	size_t len = M_FindPNGChunk (png, id);
	size_t used = 0;

	if (len != 0)
	{
		DWORD var;
		size_t i;
		FPNGChunkArchive arc (png->File->GetFile(), id, len);
		used = len / 4;

		for (i = 0; i < used; ++i)
		{
			arc << var;
			vars[i] = var;
		}
		png->File->ResetFilePtr();
	}
	if (used < count)
	{
		memset (&vars[used], 0, (count-used)*4);
	}
}